

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

void duckdb::alp::AlpCompression<double,_false>::Compress
               (double *input_vector,idx_t n_values,uint16_t *vector_null_positions,
               idx_t nulls_count,State *state)

{
  int64_t *piVar1;
  double dVar2;
  long lVar3;
  uint64_t uVar4;
  bool bVar5;
  reference pvVar6;
  int64_t iVar7;
  unsigned_long uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  uint64_t uVar14;
  int64_t *in;
  uint64_t uVar15;
  idx_t iVar16;
  ulong uVar17;
  uint32_t bit;
  ulong uVar18;
  double dVar19;
  long local_150;
  uint64_t local_138 [33];
  
  if ((ulong)(((long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(state->best_k_combinations).
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
    pvVar6 = vector<duckdb::alp::AlpCombination,_true>::operator[](&state->best_k_combinations,0);
    state->vector_encoding_indices = pvVar6->encoding_indices;
  }
  else {
    FindBestFactorAndExponent(input_vector,n_values,state);
  }
  uVar15 = 0x7fffffffffffffff;
  uVar13 = 0;
  if (n_values != 0) {
    local_150 = 0x7ffffffffffffc00;
    iVar16 = 0;
    uVar13 = 0;
    do {
      dVar2 = input_vector[iVar16];
      dVar19 = *(double *)
                (AlpTypedConstants<double>::EXP_ARR +
                (ulong)((ushort)state->vector_encoding_indices & 0xff) * 8) * dVar2 *
               *(double *)
                (AlpTypedConstants<double>::FRAC_ARR +
                (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      bVar5 = IsImpossibleToEncode(dVar19);
      lVar10 = (long)(dVar19 + 6755399441055744.0 + -6755399441055744.0);
      if (bVar5) {
        lVar10 = local_150;
      }
      lVar3 = *(long *)(AlpConstants::FACT_ARR +
                       (ulong)((ushort)state->vector_encoding_indices >> 8) * 8);
      dVar19 = *(double *)
                (AlpTypedConstants<double>::FRAC_ARR +
                (ulong)((ushort)state->vector_encoding_indices & 0xff) * 8);
      state->encoded_integers[iVar16] = lVar10;
      state->exceptions_positions[uVar13] = (uint16_t)iVar16;
      uVar13 = uVar13 + ((double)lVar3 * (double)lVar10 * dVar19 != dVar2);
      iVar16 = iVar16 + 1;
    } while (n_values != iVar16);
  }
  iVar7 = 0;
  if (n_values != 0) {
    uVar11 = 0;
    do {
      if (uVar11 != state->exceptions_positions[uVar11]) {
        iVar7 = state->encoded_integers[uVar11];
        break;
      }
      uVar11 = uVar11 + 1;
    } while (n_values != uVar11);
  }
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      dVar2 = input_vector[state->exceptions_positions[uVar11]];
      state->encoded_integers[state->exceptions_positions[uVar11]] = iVar7;
      state->exceptions[uVar11] = dVar2;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  state->exceptions_count = uVar13;
  if (nulls_count != 0) {
    iVar16 = 0;
    do {
      state->encoded_integers[vector_null_positions[iVar16]] = iVar7;
      iVar16 = iVar16 + 1;
    } while (nulls_count != iVar16);
  }
  uVar14 = 0x8000000000000000;
  if (n_values != 0) {
    iVar16 = 0;
    uVar15 = 0x7fffffffffffffff;
    do {
      uVar4 = state->encoded_integers[iVar16];
      if ((long)uVar14 <= (long)uVar4) {
        uVar14 = uVar4;
      }
      if ((long)uVar15 < (long)uVar4) {
        uVar4 = uVar15;
      }
      uVar15 = uVar4;
      iVar16 = iVar16 + 1;
    } while (n_values != iVar16);
  }
  uVar11 = uVar14 - uVar15;
  piVar1 = state->encoded_integers;
  if (n_values != 0) {
    iVar16 = 0;
    do {
      piVar1[iVar16] = piVar1[iVar16] - uVar15;
      iVar16 = iVar16 + 1;
    } while (n_values != iVar16);
  }
  lVar10 = 0x3f;
  if (uVar11 != 0) {
    for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
    }
  }
  uVar9 = 0x40;
  if (uVar11 >> 0x38 == 0) {
    uVar9 = (uint)(byte)(0x40 - ((byte)lVar10 ^ 0x3f));
  }
  uVar11 = 0;
  if (uVar14 != uVar15) {
    uVar11 = (ulong)uVar9;
  }
  iVar16 = n_values;
  if ((n_values & 0x1f) != 0) {
    uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)n_values & 0x1f);
    iVar16 = (n_values - uVar8) + 0x20;
  }
  if (uVar14 != uVar15) {
    uVar12 = n_values & 0xffffffffffffffe0;
    bit = (uint32_t)uVar11;
    if (uVar12 != 0) {
      uVar17 = 0;
      uVar18 = 0;
      in = piVar1;
      do {
        duckdb_fastpforlib::fastpack
                  ((uint64_t *)in,(uint32_t *)(state->values_encoded + (uVar17 >> 3)),bit);
        uVar18 = uVar18 + 0x20;
        in = in + 0x20;
        uVar17 = uVar17 + (bit << 5);
      } while (uVar18 < uVar12);
    }
    if ((n_values & 0x1f) != 0) {
      uVar17 = (ulong)(((uint)n_values & 0x1f) << 3);
      switchD_005700f1::default((void *)((long)local_138 + uVar17),0,0x100 - uVar17);
      switchD_00b1422a::default(local_138,piVar1 + uVar12,uVar17);
      duckdb_fastpforlib::fastpack
                (local_138,(uint32_t *)(state->values_encoded + (uVar12 * uVar11 >> 3)),bit);
    }
  }
  state->bit_width = (uint16_t)uVar11;
  state->bp_size = iVar16 * uVar11 >> 3;
  state->frame_of_reference = uVar15;
  return;
}

Assistant:

static void Compress(const T *input_vector, idx_t n_values, const uint16_t *vector_null_positions,
	                     idx_t nulls_count, State &state) {
		if (state.best_k_combinations.size() > 1) {
			FindBestFactorAndExponent(input_vector, n_values, state);
		} else {
			state.vector_encoding_indices = state.best_k_combinations[0].encoding_indices;
		}

		// Encoding Floating-Point to Int64
		//! We encode all the values regardless of their correctness to recover the original floating-point
		uint16_t exceptions_idx = 0;
		for (idx_t i = 0; i < n_values; i++) {
			T actual_value = input_vector[i];
			int64_t encoded_value = EncodeValue(actual_value, state.vector_encoding_indices);
			T decoded_value = DecodeValue(encoded_value, state.vector_encoding_indices);
			state.encoded_integers[i] = encoded_value;
			//! We detect exceptions using a predicated comparison
			auto is_exception = (decoded_value != actual_value);
			state.exceptions_positions[exceptions_idx] = UnsafeNumericCast<uint16_t>(i);
			exceptions_idx += is_exception;
		}

		// Finding first non exception value
		int64_t a_non_exception_value = 0;
		for (idx_t i = 0; i < n_values; i++) {
			if (i != state.exceptions_positions[i]) {
				a_non_exception_value = state.encoded_integers[i];
				break;
			}
		}
		// Replacing that first non exception value on the vector exceptions
		for (idx_t i = 0; i < exceptions_idx; i++) {
			idx_t exception_pos = state.exceptions_positions[i];
			T actual_value = input_vector[exception_pos];
			state.encoded_integers[exception_pos] = a_non_exception_value;
			state.exceptions[i] = actual_value;
		}
		state.exceptions_count = exceptions_idx;

		// Replacing nulls with that first non exception value
		for (idx_t i = 0; i < nulls_count; i++) {
			uint16_t null_value_pos = vector_null_positions[i];
			state.encoded_integers[null_value_pos] = a_non_exception_value;
		}

		// Analyze FFOR
		auto min_value = NumericLimits<int64_t>::Maximum();
		auto max_value = NumericLimits<int64_t>::Minimum();
		for (idx_t i = 0; i < n_values; i++) {
			max_value = MaxValue(max_value, state.encoded_integers[i]);
			min_value = MinValue(min_value, state.encoded_integers[i]);
		}
		uint64_t min_max_diff = (static_cast<uint64_t>(max_value) - static_cast<uint64_t>(min_value));

		auto *u_encoded_integers = reinterpret_cast<uint64_t *>(state.encoded_integers);
		auto const u_min_value = static_cast<uint64_t>(min_value);

		// Subtract FOR
		if (!EMPTY) { //! We only execute the FOR if we are writing the data
			for (idx_t i = 0; i < n_values; i++) {
				u_encoded_integers[i] -= u_min_value;
			}
		}

		auto bit_width = BitpackingPrimitives::MinimumBitWidth<uint64_t, false>(min_max_diff);
		auto bp_size = BitpackingPrimitives::GetRequiredSize(n_values, bit_width);
		if (!EMPTY && bit_width > 0) { //! We only execute the BP if we are writing the data
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.values_encoded, u_encoded_integers, n_values,
			                                                  bit_width);
		}
		state.bit_width = bit_width;                                 // in bits
		state.bp_size = bp_size;                                     // in bytes
		state.frame_of_reference = static_cast<uint64_t>(min_value); // understood this can be negative
	}